

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

void ON_RenderContentPrivate::BuildXMLHierarchy(ON_RenderContent *rc,ON_XMLNode *node)

{
  ON_RenderContent *rc_00;
  long lVar1;
  ON_XMLNode *this;
  ON_RenderContentPrivate **ppOVar2;
  
  ppOVar2 = &rc->_private;
  ON_XMLNode::operator=(node,&rc->_private->m_node);
  lVar1 = 0x108;
  while (rc_00 = *(ON_RenderContent **)(((*ppOVar2)->m_node)._PRIVATE + lVar1 + -0x20),
        rc_00 != (ON_RenderContent *)0x0) {
    this = (ON_XMLNode *)operator_new(0xe8);
    ON_XMLNode::ON_XMLNode(this,L"");
    BuildXMLHierarchy(rc_00,this);
    (*node->_vptr_ON_XMLNode[0xb])(node,this);
    ppOVar2 = &rc_00->_private;
    lVar1 = 0x110;
  }
  return;
}

Assistant:

void ON_RenderContentPrivate::BuildXMLHierarchy(const ON_RenderContent& rc, ON_XMLNode& node) // Static.
{
  // Recursively builds 'node' from the tree structure of the XML nodes in 'rc' and its children.

  node = rc._private->m_node;

  auto* child_rc = rc._private->m_first_child;
  while (nullptr != child_rc)
  {
    auto* child_node = new ON_XMLNode(L"");
    BuildXMLHierarchy(*child_rc, *child_node);
    node.AttachChildNode(child_node);

    child_rc = child_rc->_private->m_next_sibling;
  }
}